

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMin(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *__return_storage_ptr__,
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *uvec,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *p_low,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *p_up,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *eps,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *p_delta,Status *stat,int start,int incr)

{
  uint *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  double *pdVar10;
  pointer pnVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  long lVar13;
  uint uVar14;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar15;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar16;
  pointer pnVar17;
  Real RVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *l_theShift;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_838 [48];
  double local_808;
  cpp_dec_float<50U,_int,_void> *local_800;
  cpp_dec_float<50U,_int,_void> local_7f8;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_7c0;
  undefined1 local_7b8 [48];
  undefined8 local_788;
  cpp_dec_float<50U,_int,_void> local_778;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_740;
  cpp_dec_float<50U,_int,_void> *local_738;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_730;
  double local_728;
  undefined8 uStack_720;
  Random *local_710;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_708;
  pointer local_700;
  undefined1 local_6f8 [48];
  undefined8 local_6c8;
  double local_6b8;
  undefined8 uStack_6b0;
  Random *local_6a8;
  undefined8 uStack_6a0;
  undefined1 local_698 [16];
  cpp_dec_float<50U,_int,_void> local_688;
  cpp_dec_float<50U,_int,_void> local_648;
  uint local_608 [2];
  uint auStack_600 [2];
  uint local_5f8 [2];
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  uint local_5d8 [2];
  uint auStack_5d0 [2];
  uint local_5c8 [2];
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  cpp_dec_float<50U,_int,_void> local_5a8;
  cpp_dec_float<50U,_int,_void> local_568;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_528;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a8;
  undefined1 local_468 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  undefined1 local_3a8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  undefined1 local_268 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  undefined1 local_1a8 [64];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined5 uStack_d0;
  undefined3 uStack_cb;
  undefined5 uStack_c8;
  undefined8 uStack_c3;
  undefined8 local_b8;
  cpp_dec_float<50U,_int,_void> local_a8;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 uStack_43;
  undefined8 local_38;
  
  local_700 = (uvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_648.fpclass = cpp_dec_float_finite;
  local_648.prec_elem = 10;
  local_648.data._M_elems[0] = 0;
  local_648.data._M_elems[1] = 0;
  local_648.data._M_elems[2] = 0;
  local_648.data._M_elems[3] = 0;
  local_648.data._M_elems[4] = 0;
  local_648.data._M_elems[5] = 0;
  local_648.data._M_elems._24_5_ = 0;
  local_648.data._M_elems[7]._1_3_ = 0;
  local_648.data._M_elems._32_5_ = 0;
  local_648.data._M_elems[9]._1_3_ = 0;
  local_648.exp = 0;
  local_648.neg = false;
  local_808 = 2.12199579096527e-313;
  local_838._0_4_ = 0;
  local_838._4_4_ = 0;
  local_838._8_4_ = 0;
  local_838._12_4_ = 0;
  local_838._16_4_ = 0;
  local_838._20_4_ = 0;
  local_838._24_5_ = 0;
  local_838._29_3_ = 0;
  local_838._32_5_ = 0;
  local_838._37_3_ = 0;
  local_838._40_4_ = 0;
  local_838[0x2c] = false;
  local_7c0 = uvec;
  local_740 = this;
  local_738 = &__return_storage_ptr__->m_backend;
  local_708 = p_low;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_838,10.0);
  if (&local_648 != &p_delta->m_backend) {
    uVar2 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 8);
    local_648.data._M_elems._32_5_ = SUB85(uVar2,0);
    local_648.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_648.data._M_elems._0_8_ = *(undefined8 *)(p_delta->m_backend).data._M_elems;
    local_648.data._M_elems._8_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 2);
    local_648.data._M_elems._16_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 4);
    uVar2 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 6);
    local_648.data._M_elems._24_5_ = SUB85(uVar2,0);
    local_648.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_648.exp = (p_delta->m_backend).exp;
    local_648.neg = (p_delta->m_backend).neg;
    local_648.fpclass = (p_delta->m_backend).fpclass;
    local_648.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&local_648,(cpp_dec_float<50U,_int,_void> *)local_838);
  local_688.fpclass = cpp_dec_float_finite;
  local_688.prec_elem = 10;
  local_688.data._M_elems[0] = 0;
  local_688.data._M_elems[1] = 0;
  local_688.data._M_elems[2] = 0;
  local_688.data._M_elems[3] = 0;
  local_688.data._M_elems[4] = 0;
  local_688.data._M_elems[5] = 0;
  local_688.data._M_elems._24_5_ = 0;
  local_688.data._M_elems[7]._1_3_ = 0;
  local_688.data._M_elems._32_5_ = 0;
  local_688.data._M_elems[9]._1_3_ = 0;
  local_688.exp = 0;
  local_688.neg = false;
  local_808 = 2.12199579096527e-313;
  local_838._0_4_ = 0;
  local_838._4_4_ = 0;
  local_838._8_4_ = 0;
  local_838._12_4_ = 0;
  local_838._16_4_ = 0;
  local_838._20_4_ = 0;
  local_838._24_5_ = 0;
  local_838._29_3_ = 0;
  local_838._32_5_ = 0;
  local_838._37_3_ = 0;
  local_838._40_4_ = 0;
  local_838[0x2c] = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_838,100.0);
  if (&local_688 != &p_delta->m_backend) {
    uVar2 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 8);
    local_688.data._M_elems._32_5_ = SUB85(uVar2,0);
    local_688.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_688.data._M_elems._0_8_ = *(undefined8 *)(p_delta->m_backend).data._M_elems;
    local_688.data._M_elems._8_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 2);
    local_688.data._M_elems._16_8_ = *(undefined8 *)((p_delta->m_backend).data._M_elems + 4);
    uVar2 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 6);
    local_688.data._M_elems._24_5_ = SUB85(uVar2,0);
    local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_688.exp = (p_delta->m_backend).exp;
    local_688.neg = (p_delta->m_backend).neg;
    local_688.fpclass = (p_delta->m_backend).fpclass;
    local_688.prec_elem = (p_delta->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&local_688,(cpp_dec_float<50U,_int,_void> *)local_838);
  local_6c8._0_4_ = cpp_dec_float_finite;
  local_6c8._4_4_ = 10;
  local_6f8._0_4_ = 0;
  local_6f8._4_4_ = 0;
  local_6f8._8_4_ = 0;
  local_6f8._12_4_ = 0;
  local_6f8._16_4_ = 0;
  local_6f8._20_4_ = 0;
  local_6f8._24_5_ = 0;
  local_6f8._29_3_ = 0;
  local_6f8._32_5_ = 0;
  local_6f8._37_3_ = 0;
  local_6f8._40_4_ = 0;
  local_6f8[0x2c] = false;
  local_788._0_4_ = cpp_dec_float_finite;
  local_788._4_4_ = 10;
  local_7b8._0_4_ = 0;
  local_7b8._4_4_ = 0;
  local_7b8._8_4_ = 0;
  local_7b8._12_4_ = 0;
  local_7b8._16_4_ = 0;
  local_7b8._20_4_ = 0;
  local_7b8._24_5_ = 0;
  local_7b8._29_3_ = 0;
  local_7b8._32_5_ = 0;
  local_7b8._37_3_ = 0;
  local_7b8._40_4_ = 0;
  local_7b8[0x2c] = false;
  local_778.fpclass = cpp_dec_float_finite;
  local_778.prec_elem = 10;
  local_778.data._M_elems[0] = 0;
  local_778.data._M_elems[1] = 0;
  local_778.data._M_elems[2] = 0;
  local_778.data._M_elems[3] = 0;
  local_778.data._M_elems[4] = 0;
  local_778.data._M_elems[5] = 0;
  local_778.data._M_elems._24_5_ = 0;
  local_778.data._M_elems[7]._1_3_ = 0;
  local_778.data._M_elems._32_5_ = 0;
  local_778.data._M_elems[9]._1_3_ = 0;
  local_778.exp = 0;
  local_778.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (local_738,0,(type *)0x0);
  local_730 = p_up;
  if (local_740->fullPerturbation == true) {
    *(undefined8 *)((eps->m_backend).data._M_elems + 8) =
         *(undefined8 *)((p_delta->m_backend).data._M_elems + 8);
    uVar2 = *(undefined8 *)(p_delta->m_backend).data._M_elems;
    uVar3 = *(undefined8 *)((p_delta->m_backend).data._M_elems + 2);
    uVar14 = (p_delta->m_backend).data._M_elems[5];
    uVar4 = (p_delta->m_backend).data._M_elems[6];
    uVar5 = (p_delta->m_backend).data._M_elems[7];
    (eps->m_backend).data._M_elems[4] = (p_delta->m_backend).data._M_elems[4];
    (eps->m_backend).data._M_elems[5] = uVar14;
    (eps->m_backend).data._M_elems[6] = uVar4;
    (eps->m_backend).data._M_elems[7] = uVar5;
    *(undefined8 *)(eps->m_backend).data._M_elems = uVar2;
    *(undefined8 *)((eps->m_backend).data._M_elems + 2) = uVar3;
    (eps->m_backend).exp = (p_delta->m_backend).exp;
    (eps->m_backend).neg = (p_delta->m_backend).neg;
    iVar6 = (p_delta->m_backend).prec_elem;
    (eps->m_backend).fpclass = (p_delta->m_backend).fpclass;
    (eps->m_backend).prec_elem = iVar6;
    uVar14 = (int)((ulong)((long)(local_7c0->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_7c0->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249 +
             ~start;
    if (-1 < (int)uVar14) {
      pdVar10 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_6b8 = *pdVar10;
      local_6a8 = &local_740->random;
      uStack_6b0 = 0;
      local_698._8_4_ = DAT_00358350._8_4_;
      local_698._0_8_ = (ulong)DAT_00358350 ^ (ulong)local_6b8;
      local_698._12_4_ = DAT_00358350._12_4_;
      do {
        pUVar15 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(ulong)uVar14;
        pnVar11 = (p_up->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_528.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&pnVar11[(long)pUVar15].m_backend.data + 0x20);
        local_778.data._M_elems._32_5_ = local_528.m_backend.data._M_elems._32_5_;
        local_778.data._M_elems[9]._1_3_ = local_528.m_backend.data._M_elems[9]._1_3_;
        local_778.data._M_elems._0_8_ = *(undefined8 *)&pnVar11[(long)pUVar15].m_backend.data;
        local_778.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar11[(long)pUVar15].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar11[(long)pUVar15].m_backend.data + 0x10);
        local_778.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_528.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_778.data._M_elems._24_5_ = local_528.m_backend.data._M_elems._24_5_;
        local_778.data._M_elems[7]._1_3_ = local_528.m_backend.data._M_elems[7]._1_3_;
        local_778.exp = pnVar11[(long)pUVar15].m_backend.exp;
        local_778.neg = pnVar11[(long)pUVar15].m_backend.neg;
        local_528.m_backend.fpclass = pnVar11[(long)pUVar15].m_backend.fpclass;
        local_528.m_backend.prec_elem = pnVar11[(long)pUVar15].m_backend.prec_elem;
        local_778.prec_elem = local_528.m_backend.prec_elem;
        local_778.fpclass = local_528.m_backend.fpclass;
        pnVar11 = (local_708->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(undefined8 *)((long)&pnVar11[(long)pUVar15].m_backend.data + 0x20);
        local_7b8._32_5_ = (undefined5)uVar2;
        local_7b8._37_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_7b8._0_8_ = *(undefined8 *)&pnVar11[(long)pUVar15].m_backend.data;
        local_7b8._8_8_ = *(undefined8 *)((long)&pnVar11[(long)pUVar15].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar11[(long)pUVar15].m_backend.data + 0x10);
        local_7b8._16_8_ = *(undefined8 *)puVar1;
        uVar2 = *(undefined8 *)(puVar1 + 2);
        local_7b8._24_5_ = (undefined5)uVar2;
        local_7b8._29_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_7b8._40_4_ = pnVar11[(long)pUVar15].m_backend.exp;
        local_7b8[0x2c] = pnVar11[(long)pUVar15].m_backend.neg;
        local_788 = *(double *)&pnVar11[(long)pUVar15].m_backend.fpclass;
        local_6f8._0_8_ = *(undefined8 *)&local_700[(long)pUVar15].m_backend;
        local_6f8._8_8_ = *(undefined8 *)((long)&local_700[(long)pUVar15].m_backend + 8);
        local_6f8._16_8_ = *(undefined8 *)((long)(local_700 + (long)pUVar15) + 0x10);
        uVar2 = *(undefined8 *)((long)(local_700 + (long)pUVar15) + 0x18);
        local_6f8._24_5_ = (undefined5)uVar2;
        local_6f8._29_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_6f8._32_5_ = (undefined5)*(undefined8 *)((long)(local_700 + (long)pUVar15) + 0x20);
        local_6f8._37_3_ =
             (undefined3)((ulong)*(undefined8 *)((long)(local_700 + (long)pUVar15) + 0x20) >> 0x28);
        local_6f8._40_4_ = *(undefined4 *)((long)(local_700 + (long)pUVar15) + 0x28);
        local_6f8[0x2c] = *(bool *)((long)(local_700 + (long)pUVar15) + 0x2c);
        local_6c8 = *(double *)((long)(local_700 + (long)pUVar15) + 0x30);
        local_528.m_backend.data._M_elems._0_8_ = local_778.data._M_elems._0_8_;
        local_528.m_backend.data._M_elems._8_8_ = local_778.data._M_elems._8_8_;
        local_528.m_backend.data._M_elems._16_8_ = local_778.data._M_elems._16_8_;
        local_528.m_backend.exp = local_778.exp;
        local_528.m_backend.neg = local_778.neg;
        ::soplex::infinity::__tls_init();
        local_800 = &local_700[(long)pUVar15].m_backend;
        local_38 = 0xa00000000;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        uStack_4b = 0;
        uStack_48 = 0;
        uStack_43 = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,local_6b8);
        local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_168.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_168.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_168.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_168.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_168.m_backend.exp = (eps->m_backend).exp;
        local_168.m_backend.neg = (eps->m_backend).neg;
        local_168.m_backend.fpclass = (eps->m_backend).fpclass;
        local_168.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_528,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_68,&local_168);
        if (bVar8) {
          local_1a8._37_3_ = local_7b8._37_3_;
          local_1a8._32_5_ = local_7b8._32_5_;
          local_1a8._29_3_ = local_7b8._29_3_;
          local_1a8._24_5_ = local_7b8._24_5_;
          local_1a8._16_8_ = local_7b8._16_8_;
          local_1a8._0_8_ = local_7b8._0_8_;
          local_1a8._8_8_ = local_7b8._8_8_;
          local_1a8._40_4_ = local_7b8._40_4_;
          local_1a8[0x2c] = local_7b8[0x2c];
          local_1a8._48_8_ = local_788;
          local_1e8.m_backend.data._M_elems[7]._1_3_ = local_778.data._M_elems[7]._1_3_;
          local_1e8.m_backend.data._M_elems._24_5_ = local_778.data._M_elems._24_5_;
          local_1e8.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
          local_1e8.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
          local_1e8.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
          local_1e8.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
          local_1e8.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
          local_1e8.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
          local_1e8.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
          local_1e8.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
          local_1e8.m_backend.exp = local_778.exp;
          local_1e8.m_backend.neg = local_778.neg;
          local_1e8.m_backend.fpclass = local_778.fpclass;
          local_1e8.m_backend.prec_elem = local_778.prec_elem;
          local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_228.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_228.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_228.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_228.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_228.m_backend.exp = (eps->m_backend).exp;
          local_228.m_backend.neg = (eps->m_backend).neg;
          local_228.m_backend.fpclass = (eps->m_backend).fpclass;
          local_228.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_1a8,&local_1e8,&local_228);
          if (bVar8) {
            local_808 = 2.12199579096527e-313;
            local_838._0_4_ = 0;
            local_838._4_4_ = 0;
            local_838._8_4_ = 0;
            local_838._12_4_ = 0;
            local_838._16_4_ = 0;
            local_838._20_4_ = 0;
            local_838._24_5_ = 0;
            local_838._29_3_ = 0;
            local_838._32_5_ = 0;
            local_838._37_3_ = 0;
            local_838._40_4_ = 0;
            local_838[0x2c] = false;
            pcVar12 = (cpp_dec_float<50U,_int,_void> *)local_6f8;
            if ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_838 != eps) {
              local_838._32_5_ = local_6f8._32_5_;
              local_838._37_3_ = local_6f8._37_3_;
              local_838._16_8_ = local_6f8._16_8_;
              local_838._24_5_ = local_6f8._24_5_;
              local_838._29_3_ = local_6f8._29_3_;
              local_838._0_8_ = local_6f8._0_8_;
              local_838._8_8_ = local_6f8._8_8_;
              local_838._40_4_ = local_6f8._40_4_;
              local_838[0x2c] = local_6f8[0x2c];
              local_808 = local_6c8;
              pcVar12 = &eps->m_backend;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      ((cpp_dec_float<50U,_int,_void> *)local_838,pcVar12);
            if (((local_778.fpclass != cpp_dec_float_NaN) && (local_808._0_4_ != cpp_dec_float_NaN))
               && ((iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (&local_778,(cpp_dec_float<50U,_int,_void> *)local_838),
                   iVar9 < 1 && (stat[(long)pUVar15] * local_740->theRep < 0)))) {
              local_7c0 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                             extract_double(&local_648);
              local_728 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          extract_double(&local_688);
              RVar18 = Random::next_random(local_6a8);
              local_7f8.fpclass = cpp_dec_float_finite;
              local_7f8.prec_elem = 10;
              local_7f8.data._M_elems[0] = 0;
              local_7f8.data._M_elems[1] = 0;
              local_7f8.data._M_elems[2] = 0;
              local_7f8.data._M_elems[3] = 0;
              local_7f8.data._M_elems[4] = 0;
              local_7f8.data._M_elems[5] = 0;
              local_7f8.data._M_elems._24_5_ = 0;
              local_7f8.data._M_elems[7]._1_3_ = 0;
              local_7f8.data._M_elems._32_5_ = 0;
              local_7f8.data._M_elems[9]._1_3_ = 0;
              local_7f8.exp = 0;
              local_7f8.neg = false;
              local_808 = 2.12199579096527e-313;
              local_838._0_4_ = 0;
              local_838._4_4_ = 0;
              local_838._8_4_ = 0;
              local_838._12_4_ = 0;
              local_838._16_4_ = 0;
              local_838._20_4_ = 0;
              local_838._24_5_ = 0;
              local_838._29_3_ = 0;
              local_838._32_5_ = 0;
              local_838._37_3_ = 0;
              local_838._40_4_ = 0;
              local_838[0x2c] = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_838,
                         RVar18 * local_728 + (1.0 - RVar18) * (double)local_7c0);
              if (&local_7f8 != local_800) {
                uVar2 = *(undefined8 *)((local_800->data)._M_elems + 8);
                local_7f8.data._M_elems._32_5_ = SUB85(uVar2,0);
                local_7f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                local_7f8.data._M_elems._0_8_ = *(undefined8 *)(local_800->data)._M_elems;
                local_7f8.data._M_elems._8_8_ = *(undefined8 *)((local_800->data)._M_elems + 2);
                local_7f8.data._M_elems._16_8_ = *(undefined8 *)((local_800->data)._M_elems + 4);
                uVar2 = *(undefined8 *)((local_800->data)._M_elems + 6);
                local_7f8.data._M_elems._24_5_ = SUB85(uVar2,0);
                local_7f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                local_7f8.exp = local_800->exp;
                local_7f8.neg = local_800->neg;
                local_7f8.fpclass = local_800->fpclass;
                local_7f8.prec_elem = local_800->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_7f8,(cpp_dec_float<50U,_int,_void> *)local_838);
              pnVar11 = (p_up->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)&pnVar11[(long)pUVar15].m_backend.data + 0x20) =
                   CONCAT35(local_7f8.data._M_elems[9]._1_3_,local_7f8.data._M_elems._32_5_);
              puVar1 = (uint *)((long)&pnVar11[(long)pUVar15].m_backend.data + 0x10);
              *(undefined8 *)puVar1 = local_7f8.data._M_elems._16_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT35(local_7f8.data._M_elems[7]._1_3_,local_7f8.data._M_elems._24_5_);
              *(undefined8 *)&pnVar11[(long)pUVar15].m_backend.data = local_7f8.data._M_elems._0_8_;
              *(undefined8 *)((long)&pnVar11[(long)pUVar15].m_backend.data + 8) =
                   local_7f8.data._M_elems._8_8_;
              pnVar11[(long)pUVar15].m_backend.exp = local_7f8.exp;
              pnVar11[(long)pUVar15].m_backend.neg = local_7f8.neg;
              pnVar11[(long)pUVar15].m_backend.fpclass = local_7f8.fpclass;
              pnVar11[(long)pUVar15].m_backend.prec_elem = local_7f8.prec_elem;
              pnVar11 = (p_up->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)pUVar15;
              local_808 = 2.12199579096527e-313;
              local_838._0_4_ = 0;
              local_838._4_4_ = 0;
              local_838._8_4_ = 0;
              local_838._12_4_ = 0;
              local_838._16_4_ = 0;
              local_838._20_4_ = 0;
              local_838._24_5_ = 0;
              local_838._29_3_ = 0;
              local_838._32_5_ = 0;
              local_838._37_3_ = 0;
              local_838._40_4_ = 0;
              local_838[0x2c] = false;
              if ((pointer)local_838 != pnVar11) {
                uVar2 = *(undefined8 *)((long)&(pnVar11->m_backend).data + 0x20);
                local_838._32_5_ = (undefined5)uVar2;
                local_838._37_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                local_838._0_8_ = *(undefined8 *)&(pnVar11->m_backend).data;
                local_838._8_8_ = *(undefined8 *)((long)&(pnVar11->m_backend).data + 8);
                local_838._16_8_ = *(undefined8 *)((long)&(pnVar11->m_backend).data + 0x10);
                uVar2 = *(undefined8 *)((long)&(pnVar11->m_backend).data + 0x18);
                local_838._24_5_ = (undefined5)uVar2;
                local_838._29_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                local_838._40_4_ = (pnVar11->m_backend).exp;
                local_838[0x2c] = (pnVar11->m_backend).neg;
                local_808 = *(double *)&(pnVar11->m_backend).fpclass;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_838,&local_778);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_738,(cpp_dec_float<50U,_int,_void> *)local_838);
            }
          }
        }
        bVar8 = local_7b8[0x2c];
        uVar7 = local_7b8._40_4_;
        local_5b8 = CONCAT35(local_7b8._37_3_,local_7b8._32_5_);
        uStack_5c0 = CONCAT35(local_7b8._29_3_,local_7b8._24_5_);
        local_5c8[0] = local_7b8._16_4_;
        local_5c8[1] = local_7b8._20_4_;
        local_5d8[0] = local_7b8._0_4_;
        local_5d8[1] = local_7b8._4_4_;
        auStack_5d0[0] = local_7b8._8_4_;
        auStack_5d0[1] = local_7b8._12_4_;
        local_728 = local_788;
        uStack_720 = 0;
        local_7c0 = pUVar15;
        ::soplex::infinity::__tls_init();
        local_a8.fpclass = cpp_dec_float_finite;
        local_a8.prec_elem = 10;
        local_a8.data._M_elems[0] = 0;
        local_a8.data._M_elems[1] = 0;
        local_a8.data._M_elems[2] = 0;
        local_a8.data._M_elems[3] = 0;
        local_a8.data._M_elems[4] = 0;
        local_a8.data._M_elems[5] = 0;
        local_a8.data._M_elems._24_5_ = 0;
        local_a8.data._M_elems[7]._1_3_ = 0;
        local_a8.data._M_elems._32_5_ = 0;
        local_a8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_a8,(double)local_698._0_8_);
        local_568.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_568.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_568.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_568.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_568.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_568.exp = (eps->m_backend).exp;
        local_568.neg = (eps->m_backend).neg;
        local_568.fpclass = (eps->m_backend).fpclass;
        local_568.prec_elem = (eps->m_backend).prec_elem;
        local_838._32_5_ = (undefined5)local_5b8;
        local_838._37_3_ = (undefined3)((ulong)local_5b8 >> 0x28);
        local_838._16_4_ = local_5c8[0];
        local_838._20_4_ = local_5c8[1];
        local_838._24_5_ = (undefined5)uStack_5c0;
        local_838._29_3_ = (undefined3)((ulong)uStack_5c0 >> 0x28);
        local_838._0_4_ = local_5d8[0];
        local_838._4_4_ = local_5d8[1];
        local_838._8_4_ = auStack_5d0[0];
        local_838._12_4_ = auStack_5d0[1];
        local_838._40_4_ = uVar7;
        local_838[0x2c] = bVar8;
        local_808 = local_728;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)local_838,&local_a8);
        p_up = local_730;
        pUVar16 = local_7c0;
        if (((local_808._0_4_ != cpp_dec_float_NaN) && (local_568.fpclass != cpp_dec_float_NaN)) &&
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)local_838,&local_568),
           p_up = local_730, pUVar16 = local_7c0, 0 < iVar9)) {
          local_268._37_3_ = local_7b8._37_3_;
          local_268._32_5_ = local_7b8._32_5_;
          local_268._29_3_ = local_7b8._29_3_;
          local_268._24_5_ = local_7b8._24_5_;
          local_268._16_8_ = local_7b8._16_8_;
          local_268._0_8_ = local_7b8._0_8_;
          local_268._8_8_ = local_7b8._8_8_;
          local_268._40_4_ = local_7b8._40_4_;
          local_268[0x2c] = local_7b8[0x2c];
          local_268._48_8_ = local_788;
          local_2a8.m_backend.data._M_elems[7]._1_3_ = local_778.data._M_elems[7]._1_3_;
          local_2a8.m_backend.data._M_elems._24_5_ = local_778.data._M_elems._24_5_;
          local_2a8.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
          local_2a8.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
          local_2a8.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
          local_2a8.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
          local_2a8.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
          local_2a8.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
          local_2a8.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
          local_2a8.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
          local_2a8.m_backend.exp = local_778.exp;
          local_2a8.m_backend.neg = local_778.neg;
          local_2a8.m_backend.fpclass = local_778.fpclass;
          local_2a8.m_backend.prec_elem = local_778.prec_elem;
          local_2e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_2e8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_2e8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_2e8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_2e8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_2e8.m_backend.exp = (eps->m_backend).exp;
          local_2e8.m_backend.neg = (eps->m_backend).neg;
          local_2e8.m_backend.fpclass = (eps->m_backend).fpclass;
          local_2e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_268,&local_2a8,&local_2e8);
          if (bVar8) {
            local_808 = 2.12199579096527e-313;
            local_838._0_4_ = 0;
            local_838._4_4_ = 0;
            local_838._8_4_ = 0;
            local_838._12_4_ = 0;
            local_838._16_4_ = 0;
            local_838._20_4_ = 0;
            local_838._24_5_ = 0;
            local_838._29_3_ = 0;
            local_838._32_5_ = 0;
            local_838._37_3_ = 0;
            local_838._40_4_ = 0;
            local_838[0x2c] = false;
            if ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_838 == eps) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_838,
                         (cpp_dec_float<50U,_int,_void> *)local_6f8);
              if (local_838._0_4_ != 0 || local_808._0_4_ != cpp_dec_float_finite) {
                local_838[0x2c] = local_838[0x2c] ^ 1;
              }
            }
            else {
              local_838._32_5_ = local_6f8._32_5_;
              local_838._37_3_ = local_6f8._37_3_;
              local_838._16_8_ = local_6f8._16_8_;
              local_838._24_5_ = local_6f8._24_5_;
              local_838._29_3_ = local_6f8._29_3_;
              local_838._0_8_ = local_6f8._0_8_;
              local_838._8_8_ = local_6f8._8_8_;
              local_838._40_4_ = local_6f8._40_4_;
              local_838[0x2c] = local_6f8[0x2c];
              local_808 = local_6c8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_838,&eps->m_backend);
            }
            if ((((fpclass_type)local_788 != cpp_dec_float_NaN) &&
                (local_808._0_4_ != cpp_dec_float_NaN)) &&
               ((iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_7b8,
                                    (cpp_dec_float<50U,_int,_void> *)local_838), -1 < iVar9 &&
                (stat[(long)pUVar16] * local_740->theRep < 0)))) {
              local_728 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          extract_double(&local_648);
              local_710 = (Random *)
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          extract_double(&local_688);
              RVar18 = Random::next_random(local_6a8);
              local_7f8.fpclass = cpp_dec_float_finite;
              local_7f8.prec_elem = 10;
              local_7f8.data._M_elems[0] = 0;
              local_7f8.data._M_elems[1] = 0;
              local_7f8.data._M_elems[2] = 0;
              local_7f8.data._M_elems[3] = 0;
              local_7f8.data._M_elems[4] = 0;
              local_7f8.data._M_elems[5] = 0;
              local_7f8.data._M_elems._24_5_ = 0;
              local_7f8.data._M_elems[7]._1_3_ = 0;
              local_7f8.data._M_elems._32_5_ = 0;
              local_7f8.data._M_elems[9]._1_3_ = 0;
              local_7f8.exp = 0;
              local_7f8.neg = false;
              local_808 = 2.12199579096527e-313;
              local_838._0_4_ = 0;
              local_838._4_4_ = 0;
              local_838._8_4_ = 0;
              local_838._12_4_ = 0;
              local_838._16_4_ = 0;
              local_838._20_4_ = 0;
              local_838._24_5_ = 0;
              local_838._29_3_ = 0;
              local_838._32_5_ = 0;
              local_838._37_3_ = 0;
              local_838._40_4_ = 0;
              local_838[0x2c] = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_838,
                         RVar18 * (double)local_710 + (1.0 - RVar18) * local_728);
              if (&local_7f8 != local_800) {
                uVar2 = *(undefined8 *)((local_800->data)._M_elems + 8);
                local_7f8.data._M_elems._32_5_ = SUB85(uVar2,0);
                local_7f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                local_7f8.data._M_elems._0_8_ = *(undefined8 *)(local_800->data)._M_elems;
                local_7f8.data._M_elems._8_8_ = *(undefined8 *)((local_800->data)._M_elems + 2);
                local_7f8.data._M_elems._16_8_ = *(undefined8 *)((local_800->data)._M_elems + 4);
                uVar2 = *(undefined8 *)((local_800->data)._M_elems + 6);
                local_7f8.data._M_elems._24_5_ = SUB85(uVar2,0);
                local_7f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                local_7f8.exp = local_800->exp;
                local_7f8.neg = local_800->neg;
                local_7f8.fpclass = local_800->fpclass;
                local_7f8.prec_elem = local_800->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_7f8,(cpp_dec_float<50U,_int,_void> *)local_838);
              pnVar11 = (local_708->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)&pnVar11[(long)pUVar15].m_backend.data + 0x20) =
                   CONCAT35(local_7f8.data._M_elems[9]._1_3_,local_7f8.data._M_elems._32_5_);
              puVar1 = (uint *)((long)&pnVar11[(long)pUVar15].m_backend.data + 0x10);
              *(undefined8 *)puVar1 = local_7f8.data._M_elems._16_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT35(local_7f8.data._M_elems[7]._1_3_,local_7f8.data._M_elems._24_5_);
              *(undefined8 *)&pnVar11[(long)pUVar15].m_backend.data = local_7f8.data._M_elems._0_8_;
              *(undefined8 *)((long)&pnVar11[(long)pUVar15].m_backend.data + 8) =
                   local_7f8.data._M_elems._8_8_;
              pnVar11[(long)pUVar15].m_backend.exp = local_7f8.exp;
              pnVar11[(long)pUVar15].m_backend.neg = local_7f8.neg;
              pnVar11[(long)pUVar15].m_backend.fpclass = local_7f8.fpclass;
              pnVar11[(long)pUVar15].m_backend.prec_elem = local_7f8.prec_elem;
              pnVar11 = (local_708->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)pUVar15;
              local_808 = 2.12199579096527e-313;
              local_838._0_4_ = 0;
              local_838._4_4_ = 0;
              local_838._8_4_ = 0;
              local_838._12_4_ = 0;
              local_838._16_4_ = 0;
              local_838._20_4_ = 0;
              local_838._24_5_ = 0;
              local_838._29_3_ = 0;
              local_838._32_5_ = 0;
              local_838._37_3_ = 0;
              local_838._40_4_ = 0;
              local_838[0x2c] = false;
              if ((pointer)local_838 != pnVar11) {
                uVar2 = *(undefined8 *)((long)&(pnVar11->m_backend).data + 0x20);
                local_838._32_5_ = (undefined5)uVar2;
                local_838._37_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                local_838._0_8_ = *(undefined8 *)&(pnVar11->m_backend).data;
                local_838._8_8_ = *(undefined8 *)((long)&(pnVar11->m_backend).data + 8);
                local_838._16_8_ = *(undefined8 *)((long)&(pnVar11->m_backend).data + 0x10);
                uVar2 = *(undefined8 *)((long)&(pnVar11->m_backend).data + 0x18);
                local_838._24_5_ = (undefined5)uVar2;
                local_838._29_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                local_838._40_4_ = (pnVar11->m_backend).exp;
                local_838[0x2c] = (pnVar11->m_backend).neg;
                local_808 = *(double *)&(pnVar11->m_backend).fpclass;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_838,
                         (cpp_dec_float<50U,_int,_void> *)local_7b8);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (local_738,(cpp_dec_float<50U,_int,_void> *)local_838);
            }
          }
        }
        uVar14 = (int)pUVar16 - incr;
      } while (-1 < (int)uVar14);
    }
  }
  else {
    uVar14 = ~start + (local_7c0->thedelta).super_IdxSet.num;
    if (-1 < (int)uVar14) {
      pnVar11 = (local_7c0->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar10 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_6a8 = (Random *)*pdVar10;
      local_710 = &local_740->random;
      uStack_6a0 = 0;
      local_698._8_4_ = DAT_00358350._8_4_;
      local_698._0_8_ = (ulong)DAT_00358350 ^ (ulong)local_6a8;
      local_698._12_4_ = DAT_00358350._12_4_;
      do {
        lVar13 = (long)(local_7c0->thedelta).super_IdxSet.idx[uVar14];
        uVar2 = *(undefined8 *)((long)&pnVar11[lVar13].m_backend.data + 0x20);
        local_6f8._32_5_ = (undefined5)uVar2;
        local_6f8._37_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_6f8._0_8_ = *(undefined8 *)&pnVar11[lVar13].m_backend.data;
        local_6f8._8_8_ = *(undefined8 *)((long)&pnVar11[lVar13].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar11[lVar13].m_backend.data + 0x10);
        local_6f8._16_8_ = *(undefined8 *)puVar1;
        uVar2 = *(undefined8 *)(puVar1 + 2);
        local_6f8._24_5_ = (undefined5)uVar2;
        local_6f8._29_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_6f8._40_4_ = pnVar11[lVar13].m_backend.exp;
        local_6f8[0x2c] = pnVar11[lVar13].m_backend.neg;
        local_6c8._0_4_ = pnVar11[lVar13].m_backend.fpclass;
        local_6c8._4_4_ = pnVar11[lVar13].m_backend.prec_elem;
        pnVar17 = (p_up->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(undefined8 *)((long)&pnVar17[lVar13].m_backend.data + 0x20);
        local_778.data._M_elems._32_5_ = SUB85(uVar2,0);
        local_778.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_778.data._M_elems._0_8_ = *(undefined8 *)&pnVar17[lVar13].m_backend.data;
        local_778.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar17[lVar13].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar17[lVar13].m_backend.data + 0x10);
        local_778.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar2 = *(undefined8 *)(puVar1 + 2);
        local_778.data._M_elems._24_5_ = SUB85(uVar2,0);
        local_778.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_778.exp = pnVar17[lVar13].m_backend.exp;
        local_778.neg = pnVar17[lVar13].m_backend.neg;
        local_778.fpclass = pnVar17[lVar13].m_backend.fpclass;
        local_778.prec_elem = pnVar17[lVar13].m_backend.prec_elem;
        pnVar17 = (local_708->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(undefined8 *)((long)&pnVar17[lVar13].m_backend.data + 0x20);
        local_7b8._32_5_ = (undefined5)uVar2;
        local_7b8._37_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_7b8._0_8_ = *(undefined8 *)&pnVar17[lVar13].m_backend.data;
        local_7b8._8_8_ = *(undefined8 *)((long)&pnVar17[lVar13].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar17[lVar13].m_backend.data + 0x10);
        local_7b8._16_8_ = *(undefined8 *)puVar1;
        uVar2 = *(undefined8 *)(puVar1 + 2);
        local_7b8._24_5_ = (undefined5)uVar2;
        local_7b8._29_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_7b8._40_4_ = pnVar17[lVar13].m_backend.exp;
        local_7b8[0x2c] = pnVar17[lVar13].m_backend.neg;
        local_788 = *(double *)&pnVar17[lVar13].m_backend.fpclass;
        uVar2 = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_838._32_5_ = (undefined5)uVar2;
        local_838._37_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_838._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_838._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_838._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        uVar2 = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_838._24_5_ = (undefined5)uVar2;
        local_838._29_3_ = (undefined3)((ulong)uVar2 >> 0x28);
        local_838._40_4_ = (eps->m_backend).exp;
        local_838[0x2c] = (eps->m_backend).neg;
        local_808._0_4_ = (eps->m_backend).fpclass;
        local_808._4_4_ = (eps->m_backend).prec_elem;
        if (local_838._0_4_ != 0 || local_808._0_4_ != cpp_dec_float_finite) {
          local_838[0x2c] = local_838[0x2c] ^ 1;
        }
        local_728 = (double)lVar13;
        if ((local_808._0_4_ == cpp_dec_float_NaN || (fpclass_type)local_6c8 == cpp_dec_float_NaN)
           || (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_6f8,
                                  (cpp_dec_float<50U,_int,_void> *)local_838), -1 < iVar9)) {
          if (((fpclass_type)local_6c8 != cpp_dec_float_NaN) &&
             (((eps->m_backend).fpclass != cpp_dec_float_NaN &&
              (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_6f8,&eps->m_backend),
              bVar8 = local_7b8[0x2c], 0 < iVar9)))) {
            local_5e8 = CONCAT35(local_7b8._37_3_,local_7b8._32_5_);
            uStack_5f0 = CONCAT35(local_7b8._29_3_,local_7b8._24_5_);
            local_5f8[0] = local_7b8._16_4_;
            local_5f8[1] = local_7b8._20_4_;
            local_608[0] = local_7b8._0_4_;
            local_608[1] = local_7b8._4_4_;
            auStack_600[0] = local_7b8._8_4_;
            auStack_600[1] = local_7b8._12_4_;
            local_800 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(local_800._4_4_,local_7b8._40_4_);
            local_6b8 = local_788;
            uStack_6b0 = 0;
            ::soplex::infinity::__tls_init();
            local_128.fpclass = cpp_dec_float_finite;
            local_128.prec_elem = 10;
            local_128.data._M_elems[0] = 0;
            local_128.data._M_elems[1] = 0;
            local_128.data._M_elems[2] = 0;
            local_128.data._M_elems[3] = 0;
            local_128.data._M_elems[4] = 0;
            local_128.data._M_elems[5] = 0;
            local_128.data._M_elems._24_5_ = 0;
            local_128.data._M_elems[7]._1_3_ = 0;
            local_128.data._M_elems._32_5_ = 0;
            local_128._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_128,(double)local_698._0_8_);
            local_5a8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_5a8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_5a8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_5a8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_5a8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_5a8.exp = (eps->m_backend).exp;
            local_5a8.neg = (eps->m_backend).neg;
            local_5a8.fpclass = (eps->m_backend).fpclass;
            local_5a8.prec_elem = (eps->m_backend).prec_elem;
            local_838._32_5_ = (undefined5)local_5e8;
            local_838._37_3_ = (undefined3)((ulong)local_5e8 >> 0x28);
            local_838._16_4_ = local_5f8[0];
            local_838._20_4_ = local_5f8[1];
            local_838._24_5_ = (undefined5)uStack_5f0;
            local_838._29_3_ = (undefined3)((ulong)uStack_5f0 >> 0x28);
            local_838._0_4_ = local_608[0];
            local_838._4_4_ = local_608[1];
            local_838._8_4_ = auStack_600[0];
            local_838._12_4_ = auStack_600[1];
            local_838._40_4_ = (int)local_800;
            local_838[0x2c] = bVar8;
            local_808 = local_6b8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_838,&local_128);
            p_up = local_730;
            if ((local_808._0_4_ != cpp_dec_float_NaN) &&
               ((local_5a8.fpclass != cpp_dec_float_NaN &&
                (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_838,&local_5a8),
                p_up = local_730, 0 < iVar9)))) {
              local_468._37_3_ = local_7b8._37_3_;
              local_468._32_5_ = local_7b8._32_5_;
              local_468._29_3_ = local_7b8._29_3_;
              local_468._24_5_ = local_7b8._24_5_;
              local_468._16_8_ = local_7b8._16_8_;
              local_468._0_8_ = local_7b8._0_8_;
              local_468._8_8_ = local_7b8._8_8_;
              local_468._40_4_ = local_7b8._40_4_;
              local_468[0x2c] = local_7b8[0x2c];
              local_468._48_8_ = local_788;
              local_4a8.m_backend.data._M_elems[7]._1_3_ = local_778.data._M_elems[7]._1_3_;
              local_4a8.m_backend.data._M_elems._24_5_ = local_778.data._M_elems._24_5_;
              local_4a8.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
              local_4a8.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
              local_4a8.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
              local_4a8.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
              local_4a8.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
              local_4a8.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
              local_4a8.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
              local_4a8.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
              local_4a8.m_backend.exp = local_778.exp;
              local_4a8.m_backend.neg = local_778.neg;
              local_4a8.m_backend.fpclass = local_778.fpclass;
              local_4a8.m_backend.prec_elem = local_778.prec_elem;
              local_4e8.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(eps->m_backend).data._M_elems;
              local_4e8.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 2);
              local_4e8.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 4);
              local_4e8.m_backend.data._M_elems._24_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 6);
              local_4e8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((eps->m_backend).data._M_elems + 8);
              local_4e8.m_backend.exp = (eps->m_backend).exp;
              local_4e8.m_backend.neg = (eps->m_backend).neg;
              local_4e8.m_backend.fpclass = (eps->m_backend).fpclass;
              local_4e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
              bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_468,&local_4a8,&local_4e8);
              if (bVar8) {
                local_808 = 2.12199579096527e-313;
                local_838._0_4_ = 0;
                local_838._4_4_ = 0;
                local_838._8_4_ = 0;
                local_838._12_4_ = 0;
                local_838._16_4_ = 0;
                local_838._20_4_ = 0;
                local_838._24_5_ = 0;
                local_838._29_3_ = 0;
                local_838._32_5_ = 0;
                local_838._37_3_ = 0;
                local_838._40_4_ = 0;
                local_838[0x2c] = false;
                pcVar12 = (cpp_dec_float<50U,_int,_void> *)local_7b8;
                if ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_838 != eps) {
                  local_838._32_5_ = local_7b8._32_5_;
                  local_838._37_3_ = local_7b8._37_3_;
                  local_838._16_8_ = local_7b8._16_8_;
                  local_838._24_5_ = local_7b8._24_5_;
                  local_838._29_3_ = local_7b8._29_3_;
                  local_838._0_8_ = local_7b8._0_8_;
                  local_838._8_8_ = local_7b8._8_8_;
                  local_838._40_4_ = local_7b8._40_4_;
                  local_838[0x2c] = local_7b8[0x2c];
                  local_808 = local_788;
                  pcVar12 = &eps->m_backend;
                }
                local_800 = &local_700[lVar13].m_backend;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          ((cpp_dec_float<50U,_int,_void> *)local_838,pcVar12);
                if ((((local_800->fpclass != cpp_dec_float_NaN) &&
                     (local_808._0_4_ != cpp_dec_float_NaN)) &&
                    (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (local_800,(cpp_dec_float<50U,_int,_void> *)local_838),
                    iVar9 < 1)) && (stat[(long)local_728] * local_740->theRep < 0)) {
                  local_728 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              extract_double(&local_648);
                  local_6b8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              extract_double(&local_688);
                  RVar18 = Random::next_random(local_710);
                  local_7f8.fpclass = cpp_dec_float_finite;
                  local_7f8.prec_elem = 10;
                  local_7f8.data._M_elems[0] = 0;
                  local_7f8.data._M_elems[1] = 0;
                  local_7f8.data._M_elems[2] = 0;
                  local_7f8.data._M_elems[3] = 0;
                  local_7f8.data._M_elems[4] = 0;
                  local_7f8.data._M_elems[5] = 0;
                  local_7f8.data._M_elems._24_5_ = 0;
                  local_7f8.data._M_elems[7]._1_3_ = 0;
                  local_7f8.data._M_elems._32_5_ = 0;
                  local_7f8.data._M_elems[9]._1_3_ = 0;
                  local_7f8.exp = 0;
                  local_7f8.neg = false;
                  local_808 = 2.12199579096527e-313;
                  local_838._0_4_ = 0;
                  local_838._4_4_ = 0;
                  local_838._8_4_ = 0;
                  local_838._12_4_ = 0;
                  local_838._16_4_ = 0;
                  local_838._20_4_ = 0;
                  local_838._24_5_ = 0;
                  local_838._29_3_ = 0;
                  local_838._32_5_ = 0;
                  local_838._37_3_ = 0;
                  local_838._40_4_ = 0;
                  local_838[0x2c] = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)local_838,
                             RVar18 * local_6b8 + (1.0 - RVar18) * local_728);
                  if (&local_7f8 != local_800) {
                    uVar2 = *(undefined8 *)((local_800->data)._M_elems + 8);
                    local_7f8.data._M_elems._32_5_ = SUB85(uVar2,0);
                    local_7f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                    local_7f8.data._M_elems._0_8_ = *(undefined8 *)(local_800->data)._M_elems;
                    local_7f8.data._M_elems._8_8_ = *(undefined8 *)((local_800->data)._M_elems + 2);
                    local_7f8.data._M_elems._16_8_ = *(undefined8 *)((local_800->data)._M_elems + 4)
                    ;
                    uVar2 = *(undefined8 *)((local_800->data)._M_elems + 6);
                    local_7f8.data._M_elems._24_5_ = SUB85(uVar2,0);
                    local_7f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                    local_7f8.exp = local_800->exp;
                    local_7f8.neg = local_800->neg;
                    local_7f8.fpclass = local_800->fpclass;
                    local_7f8.prec_elem = local_800->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_7f8,(cpp_dec_float<50U,_int,_void> *)local_838);
                  pnVar17 = (local_708->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  *(ulong *)((long)&pnVar17[lVar13].m_backend.data + 0x20) =
                       CONCAT35(local_7f8.data._M_elems[9]._1_3_,local_7f8.data._M_elems._32_5_);
                  puVar1 = (uint *)((long)&pnVar17[lVar13].m_backend.data + 0x10);
                  *(undefined8 *)puVar1 = local_7f8.data._M_elems._16_8_;
                  *(ulong *)(puVar1 + 2) =
                       CONCAT35(local_7f8.data._M_elems[7]._1_3_,local_7f8.data._M_elems._24_5_);
                  *(undefined8 *)&pnVar17[lVar13].m_backend.data = local_7f8.data._M_elems._0_8_;
                  *(undefined8 *)((long)&pnVar17[lVar13].m_backend.data + 8) =
                       local_7f8.data._M_elems._8_8_;
                  pnVar17[lVar13].m_backend.exp = local_7f8.exp;
                  pnVar17[lVar13].m_backend.neg = local_7f8.neg;
                  pnVar17[lVar13].m_backend.fpclass = local_7f8.fpclass;
                  pnVar17[lVar13].m_backend.prec_elem = local_7f8.prec_elem;
                  pnVar17 = (local_708->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar13;
                  local_808 = 2.12199579096527e-313;
                  local_838._0_4_ = 0;
                  local_838._4_4_ = 0;
                  local_838._8_4_ = 0;
                  local_838._12_4_ = 0;
                  local_838._16_4_ = 0;
                  local_838._20_4_ = 0;
                  local_838._24_5_ = 0;
                  local_838._29_3_ = 0;
                  local_838._32_5_ = 0;
                  local_838._37_3_ = 0;
                  local_838._40_4_ = 0;
                  local_838[0x2c] = false;
                  if ((pointer)local_838 != pnVar17) {
                    uVar2 = *(undefined8 *)((long)&(pnVar17->m_backend).data + 0x20);
                    local_838._32_5_ = (undefined5)uVar2;
                    local_838._37_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                    local_838._0_8_ = *(undefined8 *)&(pnVar17->m_backend).data;
                    local_838._8_8_ = *(undefined8 *)((long)&(pnVar17->m_backend).data + 8);
                    local_838._16_8_ = *(undefined8 *)((long)&(pnVar17->m_backend).data + 0x10);
                    uVar2 = *(undefined8 *)((long)&(pnVar17->m_backend).data + 0x18);
                    local_838._24_5_ = (undefined5)uVar2;
                    local_838._29_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                    local_838._40_4_ = (pnVar17->m_backend).exp;
                    local_838[0x2c] = (pnVar17->m_backend).neg;
                    local_808._0_4_ = (pnVar17->m_backend).fpclass;
                    local_808._4_4_ = (pnVar17->m_backend).prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            ((cpp_dec_float<50U,_int,_void> *)local_838,
                             (cpp_dec_float<50U,_int,_void> *)local_7b8);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (local_738,(cpp_dec_float<50U,_int,_void> *)local_838);
                }
              }
            }
          }
        }
        else {
          local_328.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
          local_328.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
          local_328.m_backend.data._M_elems[7]._1_3_ = local_778.data._M_elems[7]._1_3_;
          local_328.m_backend.data._M_elems._24_5_ = local_778.data._M_elems._24_5_;
          local_328.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
          local_328.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
          local_328.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
          local_328.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
          local_328.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
          local_328.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
          local_328.m_backend.exp = local_778.exp;
          local_328.m_backend.neg = local_778.neg;
          local_328.m_backend.fpclass = local_778.fpclass;
          local_328.m_backend.prec_elem = local_778.prec_elem;
          ::soplex::infinity::__tls_init();
          local_b8 = 0xa00000000;
          local_e8 = 0;
          uStack_e0 = 0;
          local_d8 = 0;
          uStack_d0 = 0;
          uStack_cb = 0;
          uStack_c8 = 0;
          uStack_c3 = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_e8,(double)local_6a8);
          local_368.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_368.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_368.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_368.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_368.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_368.m_backend.exp = (eps->m_backend).exp;
          local_368.m_backend.neg = (eps->m_backend).neg;
          local_368.m_backend.fpclass = (eps->m_backend).fpclass;
          local_368.m_backend.prec_elem = (eps->m_backend).prec_elem;
          bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_328,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e8,&local_368);
          p_up = local_730;
          if (bVar8) {
            local_3a8._37_3_ = local_7b8._37_3_;
            local_3a8._32_5_ = local_7b8._32_5_;
            local_3a8._29_3_ = local_7b8._29_3_;
            local_3a8._24_5_ = local_7b8._24_5_;
            local_3a8._16_8_ = local_7b8._16_8_;
            local_3a8._0_8_ = local_7b8._0_8_;
            local_3a8._8_8_ = local_7b8._8_8_;
            local_3a8._40_4_ = local_7b8._40_4_;
            local_3a8[0x2c] = local_7b8[0x2c];
            local_3a8._48_8_ = local_788;
            local_3e8.m_backend.data._M_elems[7]._1_3_ = local_778.data._M_elems[7]._1_3_;
            local_3e8.m_backend.data._M_elems._24_5_ = local_778.data._M_elems._24_5_;
            local_3e8.m_backend.data._M_elems[0] = local_778.data._M_elems[0];
            local_3e8.m_backend.data._M_elems[1] = local_778.data._M_elems[1];
            local_3e8.m_backend.data._M_elems[2] = local_778.data._M_elems[2];
            local_3e8.m_backend.data._M_elems[3] = local_778.data._M_elems[3];
            local_3e8.m_backend.data._M_elems[4] = local_778.data._M_elems[4];
            local_3e8.m_backend.data._M_elems[5] = local_778.data._M_elems[5];
            local_3e8.m_backend.data._M_elems[9]._1_3_ = local_778.data._M_elems[9]._1_3_;
            local_3e8.m_backend.data._M_elems._32_5_ = local_778.data._M_elems._32_5_;
            local_3e8.m_backend.exp = local_778.exp;
            local_3e8.m_backend.neg = local_778.neg;
            local_3e8.m_backend.fpclass = local_778.fpclass;
            local_3e8.m_backend.prec_elem = local_778.prec_elem;
            local_428.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_428.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_428.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_428.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_428.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_428.m_backend.exp = (eps->m_backend).exp;
            local_428.m_backend.neg = (eps->m_backend).neg;
            local_428.m_backend.fpclass = (eps->m_backend).fpclass;
            local_428.m_backend.prec_elem = (eps->m_backend).prec_elem;
            bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_3a8,&local_3e8,&local_428);
            if (bVar8) {
              local_808 = 2.12199579096527e-313;
              local_838._0_4_ = 0;
              local_838._4_4_ = 0;
              local_838._8_4_ = 0;
              local_838._12_4_ = 0;
              local_838._16_4_ = 0;
              local_838._20_4_ = 0;
              local_838._24_5_ = 0;
              local_838._29_3_ = 0;
              local_838._32_5_ = 0;
              local_838._37_3_ = 0;
              local_838._40_4_ = 0;
              local_838[0x2c] = false;
              if ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_838 == eps) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_838,&local_778);
                if (local_838._0_4_ != 0 || local_808._0_4_ != cpp_dec_float_finite) {
                  local_838[0x2c] = local_838[0x2c] ^ 1;
                }
              }
              else {
                local_838._32_5_ = local_778.data._M_elems._32_5_;
                local_838._37_3_ = local_778.data._M_elems[9]._1_3_;
                local_838._16_4_ = local_778.data._M_elems[4];
                local_838._20_4_ = local_778.data._M_elems[5];
                local_838._24_5_ = local_778.data._M_elems._24_5_;
                local_838._29_3_ = local_778.data._M_elems[7]._1_3_;
                local_838._0_4_ = local_778.data._M_elems[0];
                local_838._4_4_ = local_778.data._M_elems[1];
                local_838._8_4_ = local_778.data._M_elems[2];
                local_838._12_4_ = local_778.data._M_elems[3];
                local_838._40_4_ = local_778.exp;
                local_838[0x2c] = local_778.neg;
                local_808 = (double)local_778._48_8_;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_838,&eps->m_backend);
              }
              pcVar12 = &local_700[lVar13].m_backend;
              if (((pcVar12->fpclass != cpp_dec_float_NaN) && (local_808._0_4_ != cpp_dec_float_NaN)
                  ) && ((local_800 = pcVar12,
                        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                compare(pcVar12,(cpp_dec_float<50U,_int,_void> *)local_838),
                        -1 < iVar9 && (stat[(long)local_728] * local_740->theRep < 0)))) {
                local_728 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            extract_double(&local_648);
                local_6b8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            extract_double(&local_688);
                RVar18 = Random::next_random(local_710);
                local_7f8.fpclass = cpp_dec_float_finite;
                local_7f8.prec_elem = 10;
                local_7f8.data._M_elems[0] = 0;
                local_7f8.data._M_elems[1] = 0;
                local_7f8.data._M_elems[2] = 0;
                local_7f8.data._M_elems[3] = 0;
                local_7f8.data._M_elems[4] = 0;
                local_7f8.data._M_elems[5] = 0;
                local_7f8.data._M_elems._24_5_ = 0;
                local_7f8.data._M_elems[7]._1_3_ = 0;
                local_7f8.data._M_elems._32_5_ = 0;
                local_7f8.data._M_elems[9]._1_3_ = 0;
                local_7f8.exp = 0;
                local_7f8.neg = false;
                local_808 = 2.12199579096527e-313;
                local_838._0_4_ = 0;
                local_838._4_4_ = 0;
                local_838._8_4_ = 0;
                local_838._12_4_ = 0;
                local_838._16_4_ = 0;
                local_838._20_4_ = 0;
                local_838._24_5_ = 0;
                local_838._29_3_ = 0;
                local_838._32_5_ = 0;
                local_838._37_3_ = 0;
                local_838._40_4_ = 0;
                local_838[0x2c] = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_838,
                           RVar18 * local_6b8 + (1.0 - RVar18) * local_728);
                if (&local_7f8 != local_800) {
                  uVar2 = *(undefined8 *)((local_800->data)._M_elems + 8);
                  local_7f8.data._M_elems._32_5_ = SUB85(uVar2,0);
                  local_7f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                  local_7f8.data._M_elems._0_8_ = *(undefined8 *)(local_800->data)._M_elems;
                  local_7f8.data._M_elems._8_8_ = *(undefined8 *)((local_800->data)._M_elems + 2);
                  local_7f8.data._M_elems._16_8_ = *(undefined8 *)((local_800->data)._M_elems + 4);
                  uVar2 = *(undefined8 *)((local_800->data)._M_elems + 6);
                  local_7f8.data._M_elems._24_5_ = SUB85(uVar2,0);
                  local_7f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                  local_7f8.exp = local_800->exp;
                  local_7f8.neg = local_800->neg;
                  local_7f8.fpclass = local_800->fpclass;
                  local_7f8.prec_elem = local_800->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&local_7f8,(cpp_dec_float<50U,_int,_void> *)local_838);
                pnVar17 = (p_up->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)&pnVar17[lVar13].m_backend.data + 0x20) =
                     CONCAT35(local_7f8.data._M_elems[9]._1_3_,local_7f8.data._M_elems._32_5_);
                puVar1 = (uint *)((long)&pnVar17[lVar13].m_backend.data + 0x10);
                *(undefined8 *)puVar1 = local_7f8.data._M_elems._16_8_;
                *(ulong *)(puVar1 + 2) =
                     CONCAT35(local_7f8.data._M_elems[7]._1_3_,local_7f8.data._M_elems._24_5_);
                *(undefined8 *)&pnVar17[lVar13].m_backend.data = local_7f8.data._M_elems._0_8_;
                *(undefined8 *)((long)&pnVar17[lVar13].m_backend.data + 8) =
                     local_7f8.data._M_elems._8_8_;
                pnVar17[lVar13].m_backend.exp = local_7f8.exp;
                pnVar17[lVar13].m_backend.neg = local_7f8.neg;
                pnVar17[lVar13].m_backend.fpclass = local_7f8.fpclass;
                pnVar17[lVar13].m_backend.prec_elem = local_7f8.prec_elem;
                pnVar17 = (p_up->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar13;
                local_808 = 2.12199579096527e-313;
                local_838._0_4_ = 0;
                local_838._4_4_ = 0;
                local_838._8_4_ = 0;
                local_838._12_4_ = 0;
                local_838._16_4_ = 0;
                local_838._20_4_ = 0;
                local_838._24_5_ = 0;
                local_838._29_3_ = 0;
                local_838._32_5_ = 0;
                local_838._37_3_ = 0;
                local_838._40_4_ = 0;
                local_838[0x2c] = false;
                if ((pointer)local_838 != pnVar17) {
                  uVar2 = *(undefined8 *)((long)&(pnVar17->m_backend).data + 0x20);
                  local_838._32_5_ = (undefined5)uVar2;
                  local_838._37_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                  local_838._0_8_ = *(undefined8 *)&(pnVar17->m_backend).data;
                  local_838._8_8_ = *(undefined8 *)((long)&(pnVar17->m_backend).data + 8);
                  local_838._16_8_ = *(undefined8 *)((long)&(pnVar17->m_backend).data + 0x10);
                  uVar2 = *(undefined8 *)((long)&(pnVar17->m_backend).data + 0x18);
                  local_838._24_5_ = (undefined5)uVar2;
                  local_838._29_3_ = (undefined3)((ulong)uVar2 >> 0x28);
                  local_838._40_4_ = (pnVar17->m_backend).exp;
                  local_838[0x2c] = (pnVar17->m_backend).neg;
                  local_808._0_4_ = (pnVar17->m_backend).fpclass;
                  local_808._4_4_ = (pnVar17->m_backend).prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_838,&local_778);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_738,(cpp_dec_float<50U,_int,_void> *)local_838);
              }
            }
          }
        }
        uVar14 = uVar14 - incr;
      } while (-1 < (int)uVar14);
    }
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_738;
}

Assistant:

R SPxSolverBase<R>::perturbMin(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   const typename SPxBasisBase<R>::Desc::Status* stat,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;
   R l_theShift = 0;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps && rep() * stat[i] < 0)
         {
            p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
            l_theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps && rep() * stat[i] < 0)
         {
            p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
            l_theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         if(x < -eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps && rep() * stat[i] < 0)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               l_theShift += p_up[i] - u;
            }
         }
         else if(x > eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps && rep() * stat[i] < 0)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               l_theShift -= p_low[i] - l;
            }
         }
      }
   }

   return l_theShift;
}